

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O2

ON_V5_BrepRegionTopologyUserData * __thiscall
ON_V5_BrepRegionTopologyUserData::operator=
          (ON_V5_BrepRegionTopologyUserData *this,ON_V5_BrepRegionTopologyUserData *src)

{
  return this;
}

Assistant:

ON_V5_BrepRegionTopologyUserData& ON_V5_BrepRegionTopologyUserData::operator=(const ON_V5_BrepRegionTopologyUserData& src)
{
  // operator= is never called.
  //if ( this != &src )
  //{
  //  ON_UserData::operator=(src);
  //  m_region_topology = src.m_region_topology;
  //}
  return *this;
}